

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Trainer::Node::calcAverageStrategy(Node *this)

{
  int local_28;
  int local_24;
  int a_2;
  int a_1;
  double normalizingSum;
  int a;
  Node *this_local;
  
  if ((this->mAlreadyCalculated & 1U) == 0) {
    for (normalizingSum._4_4_ = 0; normalizingSum._4_4_ < (int)(uint)this->mActionNum;
        normalizingSum._4_4_ = normalizingSum._4_4_ + 1) {
      this->mAverageStrategy[normalizingSum._4_4_] = 0.0;
    }
    _a_2 = 0.0;
    for (local_24 = 0; local_24 < (int)(uint)this->mActionNum; local_24 = local_24 + 1) {
      _a_2 = this->mStrategySum[local_24] + _a_2;
    }
    for (local_28 = 0; local_28 < (int)(uint)this->mActionNum; local_28 = local_28 + 1) {
      if (_a_2 <= 0.0) {
        this->mAverageStrategy[local_28] = 1.0 / (double)this->mActionNum;
      }
      else {
        this->mAverageStrategy[local_28] = this->mStrategySum[local_28] / _a_2;
      }
    }
    this->mAlreadyCalculated = true;
  }
  return;
}

Assistant:

void Node::calcAverageStrategy() {
    // if average strategy has already been calculated, do nothing to reduce the calculation time
    if (mAlreadyCalculated) {
        return;
    }

    // calculate average strategy
    for (int a = 0; a < mActionNum; ++a) {
        mAverageStrategy[a] = 0.0;
    }
    double normalizingSum = 0.0;
    for (int a = 0; a < mActionNum; ++a) {
        normalizingSum += mStrategySum[a];
    }
    for (int a = 0; a < mActionNum; ++a) {
        if (normalizingSum > 0) {
            mAverageStrategy[a] = mStrategySum[a] / normalizingSum;
        } else {
            mAverageStrategy[a] = 1.0 / (double) mActionNum;
        }
    }
    mAlreadyCalculated = true;
}